

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

uint64_t PopulationCost(uint32_t *population,int length,uint32_t *trivial_sym,uint8_t *is_used)

{
  VP8LStreaks *stats_00;
  uint64_t uVar1;
  undefined1 *in_RCX;
  uint32_t *in_RDX;
  int in_ESI;
  uint32_t *in_RDI;
  VP8LStreaks stats;
  VP8LBitEntropy bit_entropy;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar2;
  uint32_t in_stack_ffffffffffffffac;
  VP8LStreaks local_50;
  VP8LBitEntropy local_38;
  undefined1 *local_20;
  uint32_t *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  (*VP8LGetEntropyUnrefined)(in_RDI,in_ESI,&local_38,&local_50);
  if (local_18 != (uint32_t *)0x0) {
    if (local_38.nonzeros != 1) {
      local_38.nonzero_code = 0xffffffff;
    }
    *local_18 = local_38.nonzero_code;
    in_stack_ffffffffffffffac = local_38.nonzero_code;
  }
  uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffa8);
  if (local_50.streaks[1][0] == 0) {
    uVar2 = CONCAT13(local_50.streaks[1][1] != 0,(int3)in_stack_ffffffffffffffa8);
  }
  *local_20 = (char)((uint)uVar2 >> 0x18);
  stats_00 = (VP8LStreaks *)
             BitsEntropyRefine((VP8LBitEntropy *)CONCAT44(in_stack_ffffffffffffffac,uVar2));
  uVar1 = FinalHuffmanCost(stats_00);
  return (long)stats_00->counts + uVar1;
}

Assistant:

static uint64_t PopulationCost(const uint32_t* const population, int length,
                               uint32_t* const trivial_sym,
                               uint8_t* const is_used) {
  VP8LBitEntropy bit_entropy;
  VP8LStreaks stats;
  VP8LGetEntropyUnrefined(population, length, &bit_entropy, &stats);
  if (trivial_sym != NULL) {
    *trivial_sym = (bit_entropy.nonzeros == 1) ? bit_entropy.nonzero_code
                                               : VP8L_NON_TRIVIAL_SYM;
  }
  // The histogram is used if there is at least one non-zero streak.
  *is_used = (stats.streaks[1][0] != 0 || stats.streaks[1][1] != 0);

  return BitsEntropyRefine(&bit_entropy) + FinalHuffmanCost(&stats);
}